

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

int Gia_ManFindChains_rec
              (Gia_Man_t *p,int iMaj,Vec_Int_t *vFadds,Vec_Int_t *vMap,Vec_Int_t *vLength)

{
  int *piVar1;
  int i;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Gia_Obj_t *pGVar8;
  int local_4c;
  
  iVar2 = Vec_IntEntry(vMap,iMaj);
  if (iVar2 < 0) {
    __assert_fail("Vec_IntEntry(vMap, iMaj) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                  ,0x1dc,
                  "int Gia_ManFindChains_rec(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  iVar2 = Vec_IntEntry(vLength,iMaj);
  if (-1 < iVar2) {
    iVar2 = Vec_IntEntry(vLength,iMaj);
    return iVar2;
  }
  pGVar8 = Gia_ManObj(p,iMaj);
  if ((-1 < (int)(uint)*(undefined8 *)pGVar8) &&
     (((uint)*(undefined8 *)pGVar8 & 0x1fffffff) != 0x1fffffff)) {
    iVar2 = Vec_IntEntry(vMap,iMaj);
    i = iVar2 * 5;
    iVar3 = Vec_IntEntry(vFadds,i);
    local_4c = iVar2 * 5 + 1;
    iVar4 = Vec_IntEntry(vFadds,local_4c);
    iVar2 = iVar2 * 5 + 2;
    iVar5 = Vec_IntEntry(vFadds,iVar2);
    iVar6 = Vec_IntEntry(vMap,iVar3);
    iVar7 = 0;
    if (iVar6 != -1) {
      iVar7 = Gia_ManFindChains_rec(p,iVar3,vFadds,vMap,vLength);
    }
    iVar3 = Vec_IntEntry(vMap,iVar4);
    iVar6 = 0;
    if (iVar3 != -1) {
      iVar6 = Gia_ManFindChains_rec(p,iVar4,vFadds,vMap,vLength);
    }
    iVar3 = Vec_IntEntry(vMap,iVar5);
    if (iVar3 == -1) {
      iVar3 = 0;
    }
    else {
      iVar3 = Gia_ManFindChains_rec(p,iVar5,vFadds,vMap,vLength);
    }
    iVar4 = iVar3;
    if (iVar3 < iVar6) {
      iVar4 = iVar6;
    }
    iVar5 = iVar4;
    if (iVar4 < iVar7) {
      iVar5 = iVar7;
    }
    if ((iVar7 < iVar4) && ((iVar5 == iVar6 || (local_4c = iVar2, iVar5 == iVar3)))) {
      piVar1 = vFadds->pArray;
      iVar2 = piVar1[i];
      piVar1[i] = piVar1[local_4c];
      piVar1[local_4c] = iVar2;
    }
    Vec_IntWriteEntry(vLength,iMaj,iVar5 + 1);
    return iVar5 + 1;
  }
  __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p, iMaj))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                ,0x1df,
                "int Gia_ManFindChains_rec(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

int Gia_ManFindChains_rec( Gia_Man_t * p, int iMaj, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Int_t * vLength )
{
    assert( Vec_IntEntry(vMap, iMaj) >= 0 ); // MAJ
    if ( Vec_IntEntry(vLength, iMaj) >= 0 )
        return Vec_IntEntry(vLength, iMaj);
    assert( Gia_ObjIsAnd(Gia_ManObj(p, iMaj)) );
    {
        int iFadd = Vec_IntEntry( vMap, iMaj );
        int iXor0 = Vec_IntEntry( vFadds, 5*iFadd+0 );
        int iXor1 = Vec_IntEntry( vFadds, 5*iFadd+1 );
        int iXor2 = Vec_IntEntry( vFadds, 5*iFadd+2 );
        int iLen0 = Vec_IntEntry( vMap, iXor0 ) == -1 ? 0 : Gia_ManFindChains_rec( p, iXor0, vFadds, vMap, vLength );
        int iLen1 = Vec_IntEntry( vMap, iXor1 ) == -1 ? 0 : Gia_ManFindChains_rec( p, iXor1, vFadds, vMap, vLength );
        int iLen2 = Vec_IntEntry( vMap, iXor2 ) == -1 ? 0 : Gia_ManFindChains_rec( p, iXor2, vFadds, vMap, vLength );
        int iLen = Abc_MaxInt( iLen0, Abc_MaxInt(iLen1, iLen2) );
        if ( iLen0 < iLen )
        {
            if ( iLen == iLen1 )
            {
                ABC_SWAP( int, Vec_IntArray(vFadds)[5*iFadd+0], Vec_IntArray(vFadds)[5*iFadd+1] );
            }
            else if ( iLen == iLen2 )
            {
                ABC_SWAP( int, Vec_IntArray(vFadds)[5*iFadd+0], Vec_IntArray(vFadds)[5*iFadd+2] );
            }
        }
        Vec_IntWriteEntry( vLength, iMaj, iLen + 1 );
        return iLen + 1;
    }
}